

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-gvec.c
# Opt level: O3

void tcg_gen_gvec_sars_sparc
               (TCGContext_conflict7 *tcg_ctx,uint vece,uint32_t dofs,uint32_t aofs,TCGv_i32 shift,
               uint32_t oprsz,uint32_t maxsz)

{
  do_gvec_shifts(tcg_ctx,vece,dofs,aofs,shift,oprsz,maxsz,&tcg_gen_gvec_sars_sparc::g);
  return;
}

Assistant:

void tcg_gen_gvec_sars(TCGContext *tcg_ctx, unsigned vece, uint32_t dofs, uint32_t aofs,
                       TCGv_i32 shift, uint32_t oprsz, uint32_t maxsz)
{
    static const GVecGen2sh g = {
        .fni4 = tcg_gen_sar_i32,
        .fni8 = tcg_gen_sar_i64,
        .fniv_s = tcg_gen_sars_vec,
        .fniv_v = tcg_gen_sarv_vec,
        .fno = {
            gen_helper_gvec_sar8i,
            gen_helper_gvec_sar16i,
            gen_helper_gvec_sar32i,
            gen_helper_gvec_sar64i,
        },
        .s_list = { INDEX_op_sars_vec, 0 },
        .v_list = { INDEX_op_sarv_vec, 0 },
    };

    tcg_debug_assert(vece <= MO_64);
    do_gvec_shifts(tcg_ctx, vece, dofs, aofs, shift, oprsz, maxsz, &g);
}